

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O0

int __thiscall
FIX::SocketServer::accept(SocketServer *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  mapped_type mVar1;
  socket_handle s;
  mapped_type *pmVar2;
  socket_handle result;
  SocketInfo info;
  socket_handle socket_local;
  SocketServer *this_local;
  
  info.m_sendBufSize = __fd;
  unique0x100000ca = this;
  pmVar2 = std::
           map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
           ::operator[](&this->m_socketToInfo,&info.m_sendBufSize);
  mVar1 = *pmVar2;
  info._0_8_ = *(undefined8 *)&pmVar2->m_sendBufSize;
  s = socket_accept(info.m_sendBufSize);
  if (((undefined1  [16])mVar1 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
    socket_setsockopt(s,1);
  }
  if (info.m_socket != 0) {
    socket_setsockopt(s,7,info.m_socket);
  }
  if (info._4_4_ != 0) {
    socket_setsockopt(s,8,info._4_4_);
  }
  if (s != -1) {
    SocketMonitor::addConnect(&this->m_monitor,s);
  }
  return s;
}

Assistant:

socket_handle SocketServer::accept(socket_handle socket) {
  SocketInfo info = m_socketToInfo[socket];

  socket_handle result = socket_accept(socket);
  if (info.m_noDelay) {
    socket_setsockopt(result, TCP_NODELAY);
  }
  if (info.m_sendBufSize) {
    socket_setsockopt(result, SO_SNDBUF, info.m_sendBufSize);
  }
  if (info.m_rcvBufSize) {
    socket_setsockopt(result, SO_RCVBUF, info.m_rcvBufSize);
  }
  if (result != INVALID_SOCKET_HANDLE) {
    m_monitor.addConnect(result);
  }
  return result;
}